

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<int,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,int *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  int iVar1;
  float fVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  ImVec2 IVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  int *piVar8;
  int iVar9;
  ImU32 col;
  ImPlotPoint *pIVar10;
  int iVar11;
  ImPlotContext *gp;
  long lVar12;
  long lVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  double dVar16;
  ImVec4 IVar17;
  GetterHeatmap<int> getter;
  ImVec2 b;
  ImVec2 local_178;
  double local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  undefined1 local_158 [16];
  double local_140;
  double local_138;
  int *local_130;
  double local_128;
  double local_120;
  long local_118;
  long local_110;
  double local_108;
  double local_100;
  char *local_f8;
  ImDrawList *local_f0;
  int *local_e8;
  double local_e0;
  GetterHeatmap<int> local_d8;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLin> local_78;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  
  pIVar6 = GImPlot;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    iVar9 = *values;
    iVar11 = iVar9;
    if (1 < cols * rows) {
      uVar14 = 1;
      do {
        iVar1 = values[uVar14];
        if (iVar1 < iVar11) {
          iVar11 = iVar1;
        }
        if (iVar9 < iVar1) {
          iVar9 = iVar1;
        }
        uVar14 = uVar14 + 1;
      } while ((uint)(cols * rows) != uVar14);
    }
    scale_min = (double)iVar11;
    scale_max = (double)iVar9;
  }
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar16 = -1.0;
      pIVar10 = bounds_max;
    }
    else {
      dVar16 = 1.0;
      pIVar10 = bounds_min;
    }
    local_128 = pIVar10->y;
    local_d8.XRef = bounds_min->x;
    local_170 = (double)cols;
    local_d8.Width = (bounds_max->x - local_d8.XRef) / local_170;
    local_158._8_8_ = local_158._0_8_;
    local_158._0_8_ = (double)rows;
    local_d8.Height = (bounds_max->y - bounds_min->y) / (double)rows;
    local_d8.Count = cols * rows;
    local_d8.HalfSize.x = local_d8.Width * 0.5;
    local_d8.HalfSize.y = local_d8.Height * 0.5;
    pIVar3 = GImPlot->CurrentPlot;
    fVar2 = (float)pIVar3->CurrentYAxis;
    local_d8.Values = values;
    local_d8.Rows = rows;
    local_d8.Cols = cols;
    local_d8.ScaleMin = scale_min;
    local_d8.ScaleMax = scale_max;
    local_d8.YRef = local_128;
    local_d8.YDir = dVar16;
    switch(GImPlot->Scales[(int)fVar2]) {
    case 0:
      local_78.Transformer = (TransformerLinLin *)&local_178;
      local_178.x = fVar2;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLin>>
                (&local_78,DrawList,&pIVar3->PlotRect);
      break;
    case 1:
      local_78.Transformer = (TransformerLinLin *)&local_178;
      local_178.x = fVar2;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLin> *)&local_78,
                 DrawList,&pIVar3->PlotRect);
      break;
    case 2:
      local_78.Transformer = (TransformerLinLin *)&local_178;
      local_178.x = fVar2;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLog> *)&local_78,
                 DrawList,&pIVar3->PlotRect);
      break;
    case 3:
      local_78.Transformer = (TransformerLinLin *)&local_178;
      local_178.x = fVar2;
      local_78.Getter = &local_d8;
      local_78.Prims = local_d8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLog> *)&local_78,
                 DrawList,&pIVar3->PlotRect);
    }
    if ((fmt != (char *)0x0) && (0 < rows)) {
      dVar4 = (bounds_max->x - bounds_min->x) / local_170;
      local_138 = (bounds_max->y - bounds_min->y) / (double)local_158._0_8_;
      lVar12 = (long)transformer.YAxis;
      local_140 = local_138 * 0.5;
      dVar15 = dVar4 * 0.5;
      local_110 = lVar12 << 4;
      local_120 = 0.0;
      local_15c = 0;
      local_160 = 0;
      local_168 = rows;
      local_164 = cols;
      local_130 = values;
      local_118 = lVar12;
      local_108 = dVar15;
      local_100 = dVar4;
      local_f8 = fmt;
      local_f0 = DrawList;
      iVar9 = cols;
      do {
        if (0 < iVar9) {
          local_e0 = (local_138 * local_120 + local_140) * dVar16 + local_128;
          local_e8 = values + local_160;
          local_170 = 0.0;
          lVar13 = 0;
          do {
            pIVar6 = GImPlot;
            local_158._0_8_ = local_170 * dVar4 + bounds_min->x + dVar15;
            dVar15 = log10(local_e0 / GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
            piVar8 = local_e8;
            pIVar3 = pIVar6->CurrentPlot;
            dVar4 = pIVar3->YAxis[lVar12].Range.Min;
            local_158 = ZEXT416((uint)(float)(((double)local_158._0_8_ - (pIVar3->XAxis).Range.Min)
                                              * pIVar6->Mx +
                                             (double)*(float *)((long)&pIVar6->PixelRange[0].Min.x +
                                                               local_110)));
            dVar4 = (((double)(float)(dVar15 / pIVar6->LogDenY[local_118]) *
                      (pIVar3->YAxis[lVar12].Range.Max - dVar4) + dVar4) - dVar4) *
                    pIVar6->My[local_118] +
                    (double)*(float *)((long)&pIVar6->PixelRange[0].Min.y + local_110);
            uStack_44 = (undefined4)((ulong)dVar4 >> 0x20);
            local_48 = (float)dVar4;
            sprintf((char *)&local_78,local_f8,(ulong)(uint)local_e8[lVar13]);
            IVar5 = ImGui::CalcTextSize((char *)&local_78,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_4_ = IVar5.x;
            local_58._4_4_ = IVar5.y;
            local_58._12_4_ = extraout_XMM0_Dd;
            dVar4 = ((double)piVar8[lVar13] - scale_min) / (scale_max - scale_min);
            dVar15 = 1.0;
            if (dVar4 <= 1.0) {
              dVar15 = dVar4;
            }
            IVar17 = SampleColormap((float)(double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar15),-1);
            local_178.x = (float)local_158._0_4_ - (float)local_58._0_4_ * 0.5;
            local_178.y = local_48 - (float)local_58._4_4_ * 0.5;
            ImDrawList::AddText(local_f0,&local_178,
                                -(uint)(IVar17.z * 0.114 + IVar17.x * 0.299 + IVar17.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_78,(char *)0x0);
            local_170 = local_170 + 1.0;
            lVar13 = lVar13 + 1;
            dVar15 = local_108;
            dVar4 = local_100;
          } while (cols != (int)lVar13);
          local_160 = local_160 + (int)lVar13;
          values = local_130;
          rows = local_168;
          iVar9 = local_164;
        }
        local_120 = local_120 + 1.0;
        local_15c = local_15c + 1;
      } while (local_15c != rows);
    }
  }
  else {
    dVar4 = log10(bounds_min->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar7 = GImPlot;
    pIVar3 = pIVar6->CurrentPlot;
    dVar16 = pIVar3->YAxis[transformer.YAxis].Range.Min;
    local_d8.Values =
         (int *)CONCAT44((float)((((double)(float)(dVar4 / pIVar6->LogDenY[transformer.YAxis]) *
                                   (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar16) + dVar16) -
                                 dVar16) * pIVar6->My[transformer.YAxis] +
                                (double)pIVar6->PixelRange[transformer.YAxis].Min.y),
                         (float)((bounds_min->x - (pIVar3->XAxis).Range.Min) * pIVar6->Mx +
                                (double)pIVar6->PixelRange[transformer.YAxis].Min.x));
    dVar4 = log10(bounds_max->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar3 = pIVar7->CurrentPlot;
    dVar16 = pIVar3->YAxis[transformer.YAxis].Range.Min;
    local_78.Getter =
         (GetterHeatmap<int> *)
         CONCAT44((float)((((double)(float)(dVar4 / pIVar7->LogDenY[transformer.YAxis]) *
                            (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar16) + dVar16) - dVar16
                          ) * pIVar7->My[transformer.YAxis] +
                         (double)pIVar7->PixelRange[transformer.YAxis].Min.y),
                  (float)((bounds_max->x - (pIVar3->XAxis).Range.Min) * pIVar7->Mx +
                         (double)pIVar7->PixelRange[transformer.YAxis].Min.x));
    col = GetColormapColorU32(0,(pIVar6->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)&local_d8,(ImVec2 *)&local_78,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}